

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NamedLabelSyntax *args_2;
  EmptyStatementSyntax *pEVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  NamedLabelSyntax *in_stack_ffffffffffffffc0;
  
  if (*(long *)(__fn + 0x18) == 0) {
    args_2 = (NamedLabelSyntax *)0x0;
  }
  else {
    args_2 = deepClone<slang::syntax::NamedLabelSyntax>
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::EmptyStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)TVar2.info,TVar2._0_8_,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (Token *)args_2);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const EmptyStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<EmptyStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.semicolon.deepClone(alloc)
    );
}